

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
* __thiscall
Lib::
OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
::operator=(OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
            *this,OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
                  *other)

{
  byte *in_RSI;
  OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
  *in_RDI;
  MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>
  *in_stack_ffffffffffffffa8;
  EVP_PKEY_CTX local_28 [24];
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
            *)0x837927);
    MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>
    ::~MappingIterator((MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>
                        *)0x83792f);
  }
  if ((*local_10 & 1) != 0) {
    unwrap((OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
            *)0x837951);
    move_if_value<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>,_true>
              (in_stack_ffffffffffffffa8);
    MaybeUninit<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
    ::init(&in_RDI->_elem,local_28);
    MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>
    ::~MappingIterator((MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>
                        *)0x83797e);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }